

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O1

_Bool instantiate_sha2_512
                (EverCrypt_DRBG_state_s *st,uint8_t *personalization_string,
                uint32_t personalization_string_len)

{
  uint8_t *dst;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  undefined1 uVar10;
  _Bool _Var11;
  uint32_t uVar12;
  uint32_t uVar13;
  undefined7 extraout_var;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  ulong uVar18;
  uint len;
  uint8_t *puVar19;
  uint8_t *dst_00;
  ulong __n;
  uint8_t *dst_01;
  uint8_t auStack_90 [8];
  uint8_t *local_88;
  uint32_t *local_80;
  uint8_t *local_78;
  undefined1 *local_70;
  ulong local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t auStack_50 [4];
  uint local_4c;
  undefined8 local_48;
  ulong local_40;
  state_s_tags local_31;
  ulong uVar14;
  
  if (Hacl_HMAC_DRBG_max_personalization_string_length < personalization_string_len) {
    uVar10 = 0;
  }
  else {
    auStack_90[0] = 0xfc;
    auStack_90[1] = 'a';
    auStack_90[2] = '\x17';
    auStack_90[3] = '\0';
    auStack_90[4] = '\0';
    auStack_90[5] = '\0';
    auStack_90[6] = '\0';
    auStack_90[7] = '\0';
    local_60 = personalization_string;
    uVar12 = Hacl_HMAC_DRBG_min_length('\x03');
    builtin_memcpy(auStack_90,"\tb\x17",4);
    auStack_90[4] = '\0';
    auStack_90[5] = '\0';
    auStack_90[6] = '\0';
    auStack_90[7] = '\0';
    uVar13 = Hacl_HMAC_DRBG_min_length('\x03');
    local_68 = (ulong)(uVar13 >> 1);
    len = (uVar13 >> 1) + uVar12;
    uVar14 = (ulong)len;
    lVar1 = -(uVar14 + 0xf & 0xfffffffffffffff0);
    puVar17 = (uint8_t *)((long)&local_88 + lVar1);
    puVar15 = auStack_90 + lVar1;
    local_40 = (ulong)uVar12;
    builtin_memcpy(auStack_90 + lVar1,"8b\x17",4);
    puVar15[4] = '\0';
    puVar15[5] = '\0';
    puVar15[6] = '\0';
    puVar15[7] = '\0';
    memset(puVar17,0,uVar14);
    puVar16 = auStack_90 + lVar1;
    local_48 = uVar14;
    builtin_memcpy(auStack_90 + lVar1,"Gb\x17",4);
    puVar16[4] = '\0';
    puVar16[5] = '\0';
    puVar16[6] = '\0';
    puVar16[7] = '\0';
    _Var11 = Lib_RandomBuffer_System_randombytes(puVar17,len);
    uVar14 = CONCAT71(extraout_var,_Var11);
    if (_Var11) {
      local_4c = (uint)uVar14;
      local_58 = (st->field_1).case_SHA1_s.k;
      dst = (st->field_1).case_SHA1_s.v;
      local_80 = (st->field_1).case_SHA1_s.reseed_counter;
      uVar14 = (ulong)((int)local_48 + personalization_string_len);
      local_31 = st->tag;
      __n = local_40 & 0xffffffff;
      local_88 = puVar17 + __n;
      puVar19 = puVar17 + -(uVar14 + 0xf & 0xfffffffffffffff0);
      local_70 = (undefined1 *)&local_88;
      local_48 = uVar14;
      puVar19[-8] = 0xa1;
      puVar19[-7] = 'b';
      puVar19[-6] = '\x17';
      puVar19[-5] = '\0';
      puVar19[-4] = '\0';
      puVar19[-3] = '\0';
      puVar19[-2] = '\0';
      puVar19[-1] = '\0';
      memset(puVar19,0,uVar14);
      puVar19[-8] = 0xaf;
      puVar19[-7] = 'b';
      puVar19[-6] = '\x17';
      puVar19[-5] = '\0';
      puVar19[-4] = '\0';
      puVar19[-3] = '\0';
      puVar19[-2] = '\0';
      puVar19[-1] = '\0';
      memcpy(puVar19,puVar17,__n);
      uVar14 = local_68;
      puVar17 = local_88;
      uVar18 = local_68 & 0xffffffff;
      local_78 = puVar19;
      puVar19[-8] = 0xcc;
      puVar19[-7] = 'b';
      puVar19[-6] = '\x17';
      puVar19[-5] = '\0';
      puVar19[-4] = '\0';
      puVar19[-3] = '\0';
      puVar19[-2] = '\0';
      puVar19[-1] = '\0';
      memcpy(puVar19 + __n,puVar17,uVar18);
      puVar17 = local_60;
      puVar19[-8] = 0xdd;
      puVar19[-7] = 'b';
      puVar19[-6] = '\x17';
      puVar19[-5] = '\0';
      puVar19[-4] = '\0';
      puVar19[-3] = '\0';
      puVar19[-2] = '\0';
      puVar19[-1] = '\0';
      memcpy(puVar19 + __n + uVar18,puVar17,(ulong)personalization_string_len);
      if (local_31 != '\x03') {
        puVar19[-8] = 'G';
        puVar19[-7] = 'e';
        puVar19[-6] = '\x17';
        puVar19[-5] = '\0';
        puVar19[-4] = '\0';
        puVar19[-3] = '\0';
        puVar19[-2] = '\0';
        puVar19[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,0x220,"unreachable (pattern matches are exhaustive in F*)");
        *(code **)(puVar19 + -8) = EverCrypt_DRBG_reseed;
        exit(0xff);
      }
      local_58[0x30] = '\0';
      local_58[0x31] = '\0';
      local_58[0x32] = '\0';
      local_58[0x33] = '\0';
      local_58[0x34] = '\0';
      local_58[0x35] = '\0';
      local_58[0x36] = '\0';
      local_58[0x37] = '\0';
      local_58[0x38] = '\0';
      local_58[0x39] = '\0';
      local_58[0x3a] = '\0';
      local_58[0x3b] = '\0';
      local_58[0x3c] = '\0';
      local_58[0x3d] = '\0';
      local_58[0x3e] = '\0';
      local_58[0x3f] = '\0';
      local_58[0x20] = '\0';
      local_58[0x21] = '\0';
      local_58[0x22] = '\0';
      local_58[0x23] = '\0';
      local_58[0x24] = '\0';
      local_58[0x25] = '\0';
      local_58[0x26] = '\0';
      local_58[0x27] = '\0';
      local_58[0x28] = '\0';
      local_58[0x29] = '\0';
      local_58[0x2a] = '\0';
      local_58[0x2b] = '\0';
      local_58[0x2c] = '\0';
      local_58[0x2d] = '\0';
      local_58[0x2e] = '\0';
      local_58[0x2f] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0x18] = '\0';
      local_58[0x19] = '\0';
      local_58[0x1a] = '\0';
      local_58[0x1b] = '\0';
      local_58[0x1c] = '\0';
      local_58[0x1d] = '\0';
      local_58[0x1e] = '\0';
      local_58[0x1f] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      builtin_memcpy(dst,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     ,0x40);
      *local_80 = 1;
      uVar14 = (ulong)(personalization_string_len + (int)local_40 + (int)uVar14 + 0x41);
      uVar18 = uVar14 + 0xf & 0xfffffffffffffff0;
      dst_00 = puVar19 + -uVar18;
      local_40 = uVar14;
      dst_00[-8] = 'M';
      dst_00[-7] = 'c';
      dst_00[-6] = '\x17';
      dst_00[-5] = '\0';
      dst_00[-4] = '\0';
      dst_00[-3] = '\0';
      dst_00[-2] = '\0';
      dst_00[-1] = '\0';
      memset(dst_00,0,uVar14);
      uVar2 = *(undefined8 *)dst;
      uVar3 = *(undefined8 *)(dst + 8);
      uVar4 = *(undefined8 *)(dst + 0x10);
      uVar5 = *(undefined8 *)(dst + 0x18);
      uVar6 = *(undefined8 *)(dst + 0x20);
      uVar7 = *(undefined8 *)(dst + 0x28);
      uVar8 = *(undefined8 *)(dst + 0x38);
      *(undefined8 *)(puVar19 + -uVar18 + 0x30) = *(undefined8 *)(dst + 0x30);
      *(undefined8 *)(puVar19 + -uVar18 + 0x30 + 8) = uVar8;
      *(undefined8 *)dst_00 = uVar2;
      *(undefined8 *)(dst_00 + 8) = uVar3;
      *(undefined8 *)(dst_00 + 0x10) = uVar4;
      puVar17 = local_78;
      *(undefined8 *)(dst_00 + 0x18) = uVar5;
      *(undefined8 *)(dst_00 + 0x20) = uVar6;
      *(undefined8 *)(dst_00 + 0x28) = uVar7;
      sVar9 = local_48;
      puVar19 = local_58;
      if (local_48 == 0) {
        dst_00[0x40] = '\0';
        uVar14 = local_40;
        dst_00[-8] = 0xd1;
        dst_00[-7] = 'd';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst_00,puVar19,0x40,dst_00,(uint32_t)uVar14);
        dst_00[-8] = 0xea;
        dst_00[-7] = 'd';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst,dst_00,0x40,dst,0x40);
        uVar2 = *(undefined8 *)dst_00;
        uVar3 = *(undefined8 *)(dst_00 + 8);
        uVar4 = *(undefined8 *)(dst_00 + 0x10);
        uVar5 = *(undefined8 *)(dst_00 + 0x18);
        uVar6 = *(undefined8 *)(dst_00 + 0x20);
        uVar7 = *(undefined8 *)(dst_00 + 0x28);
        uVar8 = *(undefined8 *)(dst_00 + 0x38);
        *(undefined8 *)(puVar19 + 0x30) = *(undefined8 *)(dst_00 + 0x30);
        *(undefined8 *)(puVar19 + 0x38) = uVar8;
        *(undefined8 *)(puVar19 + 0x20) = uVar6;
        *(undefined8 *)(puVar19 + 0x28) = uVar7;
        *(undefined8 *)(puVar19 + 0x10) = uVar4;
        *(undefined8 *)(puVar19 + 0x18) = uVar5;
        *(undefined8 *)puVar19 = uVar2;
        *(undefined8 *)(puVar19 + 8) = uVar3;
      }
      else {
        local_68 = -uVar18;
        dst_00[-8] = 0x9b;
        dst_00[-7] = 'c';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        memcpy(dst_00 + 0x41,puVar17,sVar9);
        puVar19 = local_58;
        dst_00[0x40] = '\0';
        uVar14 = local_40;
        dst_00[-8] = 0xbb;
        dst_00[-7] = 'c';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst_00,puVar19,0x40,dst_00,(uint32_t)uVar14);
        dst_00[-8] = 0xd4;
        dst_00[-7] = 'c';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst,dst_00,0x40,dst,0x40);
        uVar14 = local_40;
        local_60 = dst_00;
        uVar2 = *(undefined8 *)dst_00;
        uVar3 = *(undefined8 *)(dst_00 + 8);
        uVar4 = *(undefined8 *)(dst_00 + 0x10);
        uVar5 = *(undefined8 *)(dst_00 + 0x18);
        uVar6 = *(undefined8 *)(dst_00 + 0x20);
        uVar7 = *(undefined8 *)(dst_00 + 0x28);
        uVar8 = *(undefined8 *)(dst_00 + 0x38);
        *(undefined8 *)(puVar19 + 0x30) = *(undefined8 *)(dst_00 + 0x30);
        *(undefined8 *)(puVar19 + 0x38) = uVar8;
        *(undefined8 *)(puVar19 + 0x20) = uVar6;
        *(undefined8 *)(puVar19 + 0x28) = uVar7;
        *(undefined8 *)(puVar19 + 0x10) = uVar4;
        *(undefined8 *)(puVar19 + 0x18) = uVar5;
        *(undefined8 *)puVar19 = uVar2;
        *(undefined8 *)(puVar19 + 8) = uVar3;
        dst_01 = dst_00 + -uVar18;
        dst_01[-8] = '\x18';
        dst_01[-7] = 'd';
        dst_01[-6] = '\x17';
        dst_01[-5] = '\0';
        dst_01[-4] = '\0';
        dst_01[-3] = '\0';
        dst_01[-2] = '\0';
        dst_01[-1] = '\0';
        memset(dst_01,0,uVar14);
        uVar2 = *(undefined8 *)(dst + 8);
        uVar3 = *(undefined8 *)(dst + 0x10);
        uVar4 = *(undefined8 *)(dst + 0x18);
        uVar5 = *(undefined8 *)(dst + 0x20);
        uVar6 = *(undefined8 *)(dst + 0x28);
        uVar7 = *(undefined8 *)(dst + 0x30);
        uVar8 = *(undefined8 *)(dst + 0x38);
        *(undefined8 *)dst_01 = *(undefined8 *)dst;
        *(undefined8 *)(dst_01 + 8) = uVar2;
        *(undefined8 *)(dst_01 + 0x10) = uVar3;
        puVar17 = local_78;
        *(undefined8 *)(dst_01 + 0x18) = uVar4;
        *(undefined8 *)(dst_01 + 0x20) = uVar5;
        *(undefined8 *)(dst_01 + 0x28) = uVar6;
        *(undefined8 *)(dst_01 + 0x30) = uVar7;
        *(undefined8 *)(dst_01 + 0x38) = uVar8;
        sVar9 = local_48;
        dst_01[-8] = 'O';
        dst_01[-7] = 'd';
        dst_01[-6] = '\x17';
        dst_01[-5] = '\0';
        dst_01[-4] = '\0';
        dst_01[-3] = '\0';
        dst_01[-2] = '\0';
        dst_01[-1] = '\0';
        memcpy(dst_01 + 0x41,puVar17,sVar9);
        dst_01[0x40] = '\x01';
        dst_01[-8] = 'j';
        dst_01[-7] = 'd';
        dst_01[-6] = '\x17';
        dst_01[-5] = '\0';
        dst_01[-4] = '\0';
        dst_01[-3] = '\0';
        dst_01[-2] = '\0';
        dst_01[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst_01,puVar19,0x40,dst_01,(uint32_t)uVar14);
        dst_01[-8] = 0x83;
        dst_01[-7] = 'd';
        dst_01[-6] = '\x17';
        dst_01[-5] = '\0';
        dst_01[-4] = '\0';
        dst_01[-3] = '\0';
        dst_01[-2] = '\0';
        dst_01[-1] = '\0';
        EverCrypt_HMAC_compute_sha2_512(dst,dst_01,0x40,dst,0x40);
        uVar2 = *(undefined8 *)(dst_01 + 0x10);
        uVar3 = *(undefined8 *)(dst_01 + 0x18);
        uVar4 = *(undefined8 *)(dst_01 + 0x20);
        uVar5 = *(undefined8 *)(dst_01 + 0x28);
        uVar6 = *(undefined8 *)(dst_01 + 0x38);
        *(undefined8 *)(puVar19 + 0x30) = *(undefined8 *)(dst_01 + 0x30);
        *(undefined8 *)(puVar19 + 0x38) = uVar6;
        *(undefined8 *)(puVar19 + 0x20) = uVar4;
        *(undefined8 *)(puVar19 + 0x28) = uVar5;
        *(undefined8 *)(puVar19 + 0x10) = uVar2;
        *(undefined8 *)(puVar19 + 0x18) = uVar3;
        uVar2 = *(undefined8 *)(dst_00 + local_68 + 8);
        *(undefined8 *)puVar19 = *(undefined8 *)(dst_00 + local_68);
        *(undefined8 *)(puVar19 + 8) = uVar2;
      }
      uVar14 = (ulong)local_4c;
    }
    uVar10 = (undefined1)uVar14;
  }
  return (_Bool)uVar10;
}

Assistant:

static bool
instantiate_sha2_512(
  EverCrypt_DRBG_state_s *st,
  uint8_t *personalization_string,
  uint32_t personalization_string_len
)
{
  if (personalization_string_len > Hacl_HMAC_DRBG_max_personalization_string_length)
  {
    return false;
  }
  uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512);
  uint32_t nonce_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA2_512) / 2U;
  uint32_t min_entropy = entropy_input_len + nonce_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), min_entropy);
  uint8_t entropy[min_entropy];
  memset(entropy, 0U, min_entropy * sizeof (uint8_t));
  bool ok = Lib_RandomBuffer_System_randombytes(entropy, min_entropy);
  if (!ok)
  {
    return false;
  }
  uint8_t *entropy_input = entropy;
  uint8_t *nonce = entropy + entropy_input_len;
  EverCrypt_DRBG_state_s st_s = *st;
  KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + nonce_len + personalization_string_len);
  uint8_t seed_material[entropy_input_len + nonce_len + personalization_string_len];
  memset(seed_material,
    0U,
    (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len, nonce, nonce_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len + nonce_len,
    personalization_string,
    personalization_string_len * sizeof (uint8_t));
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA2_512_s)
  {
    scrut = st_s.case_SHA2_512_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  memset(k, 0U, 64U * sizeof (uint8_t));
  memset(v, 1U, 64U * sizeof (uint8_t));
  ctr[0U] = 1U;
  uint32_t input_len = 65U + entropy_input_len + nonce_len + personalization_string_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 64U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    memcpy(input0 + 65U,
      seed_material,
      (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  }
  input0[64U] = 0U;
  EverCrypt_HMAC_compute_sha2_512(k_, k, 64U, input0, input_len);
  EverCrypt_HMAC_compute_sha2_512(v, k_, 64U, v, 64U);
  memcpy(k, k_, 64U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    uint32_t input_len0 = 65U + entropy_input_len + nonce_len + personalization_string_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 64U * sizeof (uint8_t));
    if (entropy_input_len + nonce_len + personalization_string_len != 0U)
    {
      memcpy(input + 65U,
        seed_material,
        (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
    }
    input[64U] = 1U;
    EverCrypt_HMAC_compute_sha2_512(k_0, k, 64U, input, input_len0);
    EverCrypt_HMAC_compute_sha2_512(v, k_0, 64U, v, 64U);
    memcpy(k, k_0, 64U * sizeof (uint8_t));
  }
  return true;
}